

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.c
# Opt level: O2

void printIdentifier(ktx_uint8_t *identifier,_Bool json)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  char *__format;
  undefined7 in_register_00000031;
  uint32_t i;
  ulong uVar5;
  char u8identifier [30];
  
  __format = "\\x%02X";
  if ((int)CONCAT71(in_register_00000031,json) != 0) {
    __format = "\\u%04X";
  }
  uVar5 = 0;
  uVar2 = 0;
  do {
    if ((0xb < uVar5) || (0x1d < uVar2)) {
      fprintf(_stdout,"%.*s",(ulong)uVar2,u8identifier);
      return;
    }
    uVar4 = (ulong)uVar2;
    bVar1 = identifier[uVar5];
    if (bVar1 == 0xbb) {
      u8identifier[uVar4] = -0x3e;
      u8identifier[uVar4 + 1] = -0x45;
LAB_001ed309:
      uVar2 = uVar2 + 1;
    }
    else {
      if (bVar1 == 0xab) {
        u8identifier[uVar4] = -0x3e;
        u8identifier[uVar4 + 1] = -0x55;
        goto LAB_001ed309;
      }
      if (bVar1 < 0x20) {
        if (bVar1 == 0xd) {
          u8identifier[uVar4] = '\\';
          u8identifier[uVar4 + 1] = 'r';
        }
        else {
          if (bVar1 != 10) {
            iVar3 = snprintf(u8identifier + uVar4,0x1e - uVar4,__format);
            uVar2 = (uVar2 + iVar3) - 1;
            goto LAB_001ed30f;
          }
          u8identifier[uVar4] = '\\';
          u8identifier[uVar4 + 1] = 'n';
        }
        goto LAB_001ed309;
      }
      u8identifier[uVar4] = bVar1;
    }
LAB_001ed30f:
    uVar5 = uVar5 + 1;
    uVar2 = uVar2 + 1;
  } while( true );
}

Assistant:

void
printIdentifier(const ktx_uint8_t identifier[12], bool json)
{
    // Convert identifier for better display.
    uint32_t idlen = 0;
    char u8identifier[30];
    for (uint32_t i = 0; i < 12 && idlen < sizeof(u8identifier); i++, idlen++) {
        // Convert the angle brackets to utf-8 for better printing. The
        // conversion below only works for characters whose msb's are 10.
        if (identifier[i] == U'\xAB') {
            u8identifier[idlen++] = '\xc2';
            u8identifier[idlen] = identifier[i];
        } else if (identifier[i] == U'\xBB') {
            u8identifier[idlen++] = '\xc2';
            u8identifier[idlen] = identifier[i];
        } else if (identifier[i] < '\x20') {
            uint32_t nchars;
            switch (identifier[i]) {
            case '\n':
                u8identifier[idlen++] = '\\';
                u8identifier[idlen] = 'n';
                break;
            case '\r':
                u8identifier[idlen++] = '\\';
                u8identifier[idlen] = 'r';
                break;
            default:
                nchars = snprintf(&u8identifier[idlen],
                                  sizeof(u8identifier) - idlen,
                                  json ? "\\u%04X" : "\\x%02X",
                                  identifier[i]);
                idlen += nchars - 1;
            }
        } else {
            u8identifier[idlen] = identifier[i];
        }
    }
#if defined(_WIN32)
    if (_isatty(_fileno(stdout)))
        SetConsoleOutputCP(CP_UTF8);
#endif
    fprintf(stdout, "%.*s", idlen, u8identifier);
}